

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_InvalidEmpty_Test::TestBody
          (ParseCertificatePoliciesExtensionOidsTest_InvalidEmpty_Test *this)

{
  Input extension_value;
  bool bVar1;
  ParamType *pPVar2;
  char *in_R9;
  AssertHelper AStack_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  AssertionResult gtest_ar__1;
  CertErrors errors;
  string local_50;
  string der;
  
  der._M_dataplus._M_p = (pointer)&der.field_2;
  der._M_string_length = 0;
  der.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"invalid-empty.pem",(allocator<char> *)&errors);
  LoadTestData((anon_unknown_0 *)&policies,&local_50,&der);
  ::std::__cxx11::string::~string((string *)&local_50);
  if ((char)policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&errors);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&policies,
               (AssertionResult *)"LoadTestData(\"invalid-empty.pem\", &der)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x37,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&errors);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)errors.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&policies.
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&policies.
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CertErrors::CertErrors(&errors);
    extension_value.data_.size_ = der._M_string_length;
    extension_value.data_.data_ = (uchar *)der._M_dataplus._M_p;
    pPVar2 = testing::WithParamInterface<bool>::GetParam();
    bVar1 = ParseCertificatePoliciesExtensionOids(extension_value,*pPVar2,&policies,&errors);
    gtest_ar__1.success_ = !bVar1;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar__1,
                 (AssertionResult *)
                 "ParseCertificatePoliciesExtensionOids( StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies, &errors)"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x3c,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    CertErrors::~CertErrors(&errors);
    ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
              (&policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
  }
  ::std::__cxx11::string::~string((string *)&der);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}